

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O3

void __thiscall TcpSocketTest::handleData(TcpSocketTest *this,Socket *s)

{
  uint uVar1;
  undefined8 in_RAX;
  uint32_t num;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  uVar1 = (**(code **)(*(long *)s + 0x18))(s,(long)&uStack_18 + 4,4);
  if (uVar1 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x121,"Read Failed %d",(ulong)uVar1);
  }
  uStack_18 = CONCAT44(uStack_18._4_4_ + 1,(undefined4)uStack_18);
  uVar1 = (**(code **)(*(long *)s + 0x20))(s,(long)&uStack_18 + 4,4);
  if (uVar1 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x127,"Write Failed %d",(ulong)uVar1);
  }
  return;
}

Assistant:

void TcpSocketTest::handleData( Socket *s )
{
	LOG_NOTICE( "called" );
	uint32_t num;
	
	int res = s->read( &num, 4 );
	
	if ( res != 4 )
		TestFailed( "Read Failed %d", res );

	num += 1;
	res = s->write( &num, 4 );

	if ( res != 4 )
		TestFailed( "Write Failed %d", res );
}